

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

ssize_t write_block(int fd,void *buf,size_t nbyte)

{
  long lVar1;
  long lVar2;
  
  lVar1 = write(fd,buf,nbyte);
  lVar2 = 0;
  while (0 < lVar1) {
    nbyte = nbyte - lVar1;
    buf = (void *)((long)buf + lVar1);
    lVar2 = lVar2 + lVar1;
    lVar1 = write(fd,buf,nbyte);
  }
  if (lVar1 != 0) {
    lVar2 = lVar1;
  }
  return lVar2;
}

Assistant:

ssize_t write_block(int fd, const void *buf, size_t nbyte) {
  ssize_t wr;
  size_t total;
  total = 0;
  while ((wr = write(fd, buf, nbyte)) > 0) {
    nbyte -= wr;
    buf = (char *)buf + wr;
    total += wr;
  }
  if (wr < 0) {
    return wr;
  } else {
    return total;
  }
}